

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Image * __thiscall
pbrt::Image::ConvertToFormat
          (Image *__return_storage_ptr__,Image *this,PixelFormat newFormat,
          ColorEncodingHandle *encoding)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Tuple2<pbrt::Point2,_int> resolution;
  size_t sVar2;
  Allocator alloc;
  ulong uVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  Point2i p;
  int c;
  int c_00;
  Float value;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  WrapMode2D local_40;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_38;
  
  if (this->format == newFormat) {
    Image(__return_storage_ptr__,this);
  }
  else {
    pbVar1 = (this->channelNames).ptr;
    local_38.bits =
         (encoding->
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         ).bits;
    resolution = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
    sVar2 = (this->channelNames).nStored;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->channelNames).field_2;
    if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar5 = pbVar1;
    }
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    channels.n = sVar2;
    channels.ptr = pbVar5;
    Image(__return_storage_ptr__,newFormat,(Point2i)resolution,channels,
          (ColorEncodingHandle *)&local_38,alloc);
    for (lVar4 = 0; lVar4 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.y; lVar4 = lVar4 + 1)
    {
      for (uVar3 = 0; (long)uVar3 < (long)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
          uVar3 = uVar3 + 1) {
        p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(lVar4 << 0x20 | uVar3);
        for (c_00 = 0; c_00 < (int)(this->channelNames).nStored; c_00 = c_00 + 1) {
          WrapMode2D::WrapMode2D(&local_40,Clamp);
          value = GetChannel(this,p,c_00,local_40);
          SetChannel(__return_storage_ptr__,p,c_00,value);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image Image::ConvertToFormat(PixelFormat newFormat, ColorEncodingHandle encoding) const {
    if (newFormat == format)
        return *this;

    Image newImage(newFormat, resolution, channelNames, encoding);
    for (int y = 0; y < resolution.y; ++y)
        for (int x = 0; x < resolution.x; ++x)
            for (int c = 0; c < NChannels(); ++c)
                newImage.SetChannel({x, y}, c, GetChannel({x, y}, c));
    return newImage;
}